

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRTPBase.cpp
# Opt level: O1

void CATCH2_INTERNAL_TEMPLATE_TEST_0<CRTPTest&>(void)

{
  StringRef macroName;
  StringRef capturedExpression;
  CRTPTest instance;
  AssertionHandler catchAssertionHandler;
  undefined1 local_99;
  undefined1 *local_98;
  undefined1 *local_90;
  ITransientExpression local_88;
  undefined1 **local_78;
  char *local_70;
  undefined8 local_68;
  undefined1 **local_60;
  AssertionHandler local_58;
  
  local_88._vptr_ITransientExpression = (_func_int **)0x4431ff;
  local_88.m_isBinaryExpression = true;
  local_88.m_result = false;
  local_88._10_6_ = 0;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "&instance == &ref";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName,(SourceLineInfo *)&local_88,capturedExpression,Normal);
  local_98 = &local_99;
  local_78 = &local_90;
  local_60 = &local_98;
  local_88._8_2_ = 0x101;
  local_88._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_004f3ea0;
  local_70 = "==";
  local_68 = 2;
  local_90 = local_98;
  Catch::AssertionHandler::handleExpr(&local_58,&local_88);
  Catch::ITransientExpression::~ITransientExpression(&local_88);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

constexpr decltype(auto) access() &
	{
		return derived();
	}